

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void cornell_box(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  double *this_00;
  vec3 local_6b0;
  vec3 local_698;
  vec3 local_680;
  vec3 local_668;
  undefined1 local_650 [8];
  camera cam;
  vec3 local_4c8;
  shared_ptr<hittable> local_4b0;
  undefined4 local_49c;
  shared_ptr<hittable> local_498;
  shared_ptr<material> local_488;
  vec3 local_478;
  vec3 local_460;
  undefined1 local_448 [16];
  undefined1 local_438 [8];
  shared_ptr<hittable> box2;
  vec3 local_418;
  shared_ptr<hittable> local_400;
  undefined4 local_3ec;
  shared_ptr<hittable> local_3e8;
  shared_ptr<material> local_3d8;
  vec3 local_3c8;
  vec3 local_3b0;
  undefined1 local_398 [16];
  undefined1 local_388 [8];
  shared_ptr<hittable> box1;
  vec3 local_360;
  vec3 local_348;
  undefined1 local_330 [32];
  vec3 local_310;
  vec3 local_2f8;
  vec3 local_2e0;
  undefined1 local_2c8 [32];
  vec3 local_2a8;
  vec3 local_290;
  vec3 local_278;
  undefined1 local_260 [32];
  vec3 local_240;
  vec3 local_228;
  vec3 local_210;
  undefined1 local_1f8 [32];
  vec3 local_1d8;
  vec3 local_1c0;
  vec3 local_1a8;
  undefined1 local_190 [32];
  vec3 local_170;
  vec3 local_158;
  vec3 local_140;
  undefined1 local_128 [32];
  vec3 local_108;
  undefined1 local_f0 [8];
  shared_ptr<diffuse_light> light;
  undefined1 local_c8 [8];
  shared_ptr<lambertian> green;
  undefined1 local_a0 [8];
  shared_ptr<lambertian> white;
  vec3 local_80;
  undefined1 local_68 [8];
  shared_ptr<lambertian> red;
  hittable_list world;
  
  hittable_list::hittable_list
            ((hittable_list *)
             &red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  vec3::vec3(&local_80,0.65,0.05,0.05);
  std::make_shared<lambertian,vec3>((vec3 *)local_68);
  vec3::vec3((vec3 *)&green.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             0.73,0.73,0.73);
  std::make_shared<lambertian,vec3>((vec3 *)local_a0);
  vec3::vec3((vec3 *)&light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,0.12,0.45,0.15);
  std::make_shared<lambertian,vec3>((vec3 *)local_c8);
  vec3::vec3(&local_108,15.0,15.0,15.0);
  std::make_shared<diffuse_light,vec3>((vec3 *)local_f0);
  vec3::vec3(&local_140,555.0,0.0,0.0);
  vec3::vec3(&local_158,0.0,555.0,0.0);
  vec3::vec3(&local_170,0.0,0.0,555.0);
  std::make_shared<quad,vec3,vec3,vec3,std::shared_ptr<lambertian>&>
            ((vec3 *)local_128,&local_140,&local_158,(shared_ptr<lambertian> *)&local_170);
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_128 + 0x10),(shared_ptr<quad> *)local_128);
  hittable_list::add((hittable_list *)
                     &red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (shared_ptr<hittable> *)(local_128 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_128 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_128);
  vec3::vec3(&local_1a8,0.0,0.0,0.0);
  vec3::vec3(&local_1c0,0.0,555.0,0.0);
  vec3::vec3(&local_1d8,0.0,0.0,555.0);
  std::make_shared<quad,vec3,vec3,vec3,std::shared_ptr<lambertian>&>
            ((vec3 *)local_190,&local_1a8,&local_1c0,(shared_ptr<lambertian> *)&local_1d8);
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_190 + 0x10),(shared_ptr<quad> *)local_190);
  hittable_list::add((hittable_list *)
                     &red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (shared_ptr<hittable> *)(local_190 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_190 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_190);
  vec3::vec3(&local_210,343.0,554.0,332.0);
  vec3::vec3(&local_228,-130.0,0.0,0.0);
  vec3::vec3(&local_240,0.0,0.0,-105.0);
  std::make_shared<quad,vec3,vec3,vec3,std::shared_ptr<diffuse_light>&>
            ((vec3 *)local_1f8,&local_210,&local_228,(shared_ptr<diffuse_light> *)&local_240);
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_1f8 + 0x10),(shared_ptr<quad> *)local_1f8);
  hittable_list::add((hittable_list *)
                     &red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (shared_ptr<hittable> *)(local_1f8 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_1f8 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_1f8);
  vec3::vec3(&local_278,0.0,0.0,0.0);
  vec3::vec3(&local_290,555.0,0.0,0.0);
  vec3::vec3(&local_2a8,0.0,0.0,555.0);
  std::make_shared<quad,vec3,vec3,vec3,std::shared_ptr<lambertian>&>
            ((vec3 *)local_260,&local_278,&local_290,(shared_ptr<lambertian> *)&local_2a8);
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_260 + 0x10),(shared_ptr<quad> *)local_260);
  hittable_list::add((hittable_list *)
                     &red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (shared_ptr<hittable> *)(local_260 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_260 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_260);
  vec3::vec3(&local_2e0,555.0,555.0,555.0);
  vec3::vec3(&local_2f8,-555.0,0.0,0.0);
  vec3::vec3(&local_310,0.0,0.0,-555.0);
  std::make_shared<quad,vec3,vec3,vec3,std::shared_ptr<lambertian>&>
            ((vec3 *)local_2c8,&local_2e0,&local_2f8,(shared_ptr<lambertian> *)&local_310);
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_2c8 + 0x10),(shared_ptr<quad> *)local_2c8);
  hittable_list::add((hittable_list *)
                     &red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (shared_ptr<hittable> *)(local_2c8 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_2c8 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_2c8);
  vec3::vec3(&local_348,0.0,0.0,555.0);
  vec3::vec3(&local_360,555.0,0.0,0.0);
  vec3::vec3((vec3 *)&box1.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,0.0,
             555.0,0.0);
  std::make_shared<quad,vec3,vec3,vec3,std::shared_ptr<lambertian>&>
            ((vec3 *)local_330,&local_348,&local_360,
             (shared_ptr<lambertian> *)
             &box1.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_330 + 0x10),(shared_ptr<quad> *)local_330);
  hittable_list::add((hittable_list *)
                     &red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (shared_ptr<hittable> *)(local_330 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_330 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_330);
  vec3::vec3(&local_3b0,0.0,0.0,0.0);
  vec3::vec3(&local_3c8,165.0,330.0,165.0);
  std::shared_ptr<material>::shared_ptr<lambertian,void>
            (&local_3d8,(shared_ptr<lambertian> *)local_a0);
  box((point3 *)local_398,&local_3b0,(shared_ptr<material> *)&local_3c8);
  std::shared_ptr<hittable>::shared_ptr<hittable_list,void>
            ((shared_ptr<hittable> *)local_388,(shared_ptr<hittable_list> *)local_398);
  std::shared_ptr<hittable_list>::~shared_ptr((shared_ptr<hittable_list> *)local_398);
  std::shared_ptr<material>::~shared_ptr(&local_3d8);
  local_3ec = 0xf;
  std::make_shared<rotate_y,std::shared_ptr<hittable>&,int>(&local_3e8,(int *)local_388);
  std::shared_ptr<hittable>::operator=
            ((shared_ptr<hittable> *)local_388,(shared_ptr<rotate_y> *)&local_3e8);
  std::shared_ptr<rotate_y>::~shared_ptr((shared_ptr<rotate_y> *)&local_3e8);
  vec3::vec3(&local_418,265.0,0.0,295.0);
  std::make_shared<translate,std::shared_ptr<hittable>&,vec3>(&local_400,(vec3 *)local_388);
  std::shared_ptr<hittable>::operator=
            ((shared_ptr<hittable> *)local_388,(shared_ptr<translate> *)&local_400);
  std::shared_ptr<translate>::~shared_ptr((shared_ptr<translate> *)&local_400);
  this = &box2.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<hittable>::shared_ptr
            ((shared_ptr<hittable> *)this,(shared_ptr<hittable> *)local_388);
  hittable_list::add((hittable_list *)
                     &red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (shared_ptr<hittable> *)this);
  std::shared_ptr<hittable>::~shared_ptr
            ((shared_ptr<hittable> *)
             &box2.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  vec3::vec3(&local_460,0.0,0.0,0.0);
  vec3::vec3(&local_478,165.0,165.0,165.0);
  std::shared_ptr<material>::shared_ptr<lambertian,void>
            (&local_488,(shared_ptr<lambertian> *)local_a0);
  box((point3 *)local_448,&local_460,(shared_ptr<material> *)&local_478);
  std::shared_ptr<hittable>::shared_ptr<hittable_list,void>
            ((shared_ptr<hittable> *)local_438,(shared_ptr<hittable_list> *)local_448);
  std::shared_ptr<hittable_list>::~shared_ptr((shared_ptr<hittable_list> *)local_448);
  std::shared_ptr<material>::~shared_ptr(&local_488);
  local_49c = 0xffffffee;
  std::make_shared<rotate_y,std::shared_ptr<hittable>&,int>(&local_498,(int *)local_438);
  std::shared_ptr<hittable>::operator=
            ((shared_ptr<hittable> *)local_438,(shared_ptr<rotate_y> *)&local_498);
  std::shared_ptr<rotate_y>::~shared_ptr((shared_ptr<rotate_y> *)&local_498);
  vec3::vec3(&local_4c8,130.0,0.0,65.0);
  std::make_shared<translate,std::shared_ptr<hittable>&,vec3>(&local_4b0,(vec3 *)local_438);
  std::shared_ptr<hittable>::operator=
            ((shared_ptr<hittable> *)local_438,(shared_ptr<translate> *)&local_4b0);
  std::shared_ptr<translate>::~shared_ptr((shared_ptr<translate> *)&local_4b0);
  this_00 = cam.defocus_disk_v.e + 2;
  std::shared_ptr<hittable>::shared_ptr
            ((shared_ptr<hittable> *)this_00,(shared_ptr<hittable> *)local_438);
  hittable_list::add((hittable_list *)
                     &red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (shared_ptr<hittable> *)this_00);
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(cam.defocus_disk_v.e + 2));
  camera::camera((camera *)local_650);
  local_650 = (undefined1  [8])0x3ff0000000000000;
  cam.aspect_ratio._0_4_ = 600;
  cam.aspect_ratio._4_4_ = 200;
  cam.image_width = 0x32;
  vec3::vec3(&local_668,0.0,0.0,0.0);
  cam.background.e[1] = local_668.e[2];
  cam._16_8_ = local_668.e[0];
  cam.background.e[0] = local_668.e[1];
  cam.background.e[2] = 40.0;
  vec3::vec3(&local_680,278.0,278.0,-800.0);
  cam.lookfrom.e[1] = local_680.e[2];
  cam.vfov = local_680.e[0];
  cam.lookfrom.e[0] = local_680.e[1];
  vec3::vec3(&local_698,278.0,278.0,0.0);
  cam.lookat.e[1] = local_698.e[2];
  cam.lookfrom.e[2] = local_698.e[0];
  cam.lookat.e[0] = local_698.e[1];
  vec3::vec3(&local_6b0,0.0,1.0,0.0);
  cam.vup.e[1] = local_6b0.e[2];
  cam.lookat.e[2] = local_6b0.e[0];
  cam.vup.e[0] = local_6b0.e[1];
  cam.vup.e[2] = 0.0;
  camera::render((camera *)local_650,
                 (hittable *)
                 &red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)local_438);
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)local_388);
  std::shared_ptr<diffuse_light>::~shared_ptr((shared_ptr<diffuse_light> *)local_f0);
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)local_c8);
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)local_a0);
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)local_68);
  hittable_list::~hittable_list
            ((hittable_list *)
             &red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void cornell_box() {
    hittable_list world;

    auto red   = make_shared<lambertian>(color(.65, .05, .05));
    auto white = make_shared<lambertian>(color(.73, .73, .73));
    auto green = make_shared<lambertian>(color(.12, .45, .15));
    auto light = make_shared<diffuse_light>(color(15, 15, 15));

    world.add(make_shared<quad>(point3(555,0,0), vec3(0,555,0), vec3(0,0,555), green));
    world.add(make_shared<quad>(point3(0,0,0), vec3(0,555,0), vec3(0,0,555), red));
    world.add(make_shared<quad>(point3(343, 554, 332), vec3(-130,0,0), vec3(0,0,-105), light));
    world.add(make_shared<quad>(point3(0,0,0), vec3(555,0,0), vec3(0,0,555), white));
    world.add(make_shared<quad>(point3(555,555,555), vec3(-555,0,0), vec3(0,0,-555), white));
    world.add(make_shared<quad>(point3(0,0,555), vec3(555,0,0), vec3(0,555,0), white));

    shared_ptr<hittable> box1 = box(point3(0,0,0), point3(165,330,165), white);
    box1 = make_shared<rotate_y>(box1, 15);
    box1 = make_shared<translate>(box1, vec3(265,0,295));
    world.add(box1);

    shared_ptr<hittable> box2 = box(point3(0,0,0), point3(165,165,165), white);
    box2 = make_shared<rotate_y>(box2, -18);
    box2 = make_shared<translate>(box2, vec3(130,0,65));
    world.add(box2);

    camera cam;

    cam.aspect_ratio      = 1.0;
    cam.image_width       = 600;
    cam.samples_per_pixel = 200;
    cam.max_depth         = 50;
    cam.background        = color(0,0,0);

    cam.vfov     = 40;
    cam.lookfrom = point3(278, 278, -800);
    cam.lookat   = point3(278, 278, 0);
    cam.vup      = vec3(0,1,0);

    cam.defocus_angle = 0;

    cam.render(world);
}